

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pareto_dist.hpp
# Opt level: O1

basic_istream<char,_std::char_traits<char>_> *
trng::operator>>(basic_istream<char,_std::char_traits<char>_> *in,param_type *P)

{
  undefined4 uVar1;
  basic_istream<char,_std::char_traits<char>_> *pbVar2;
  istream *piVar3;
  float theta;
  float gamma;
  delim_c local_23;
  delim_c local_22;
  delim_c local_21;
  result_type_conflict1 local_20;
  result_type_conflict1 local_1c;
  
  uVar1 = *(undefined4 *)(in + *(long *)(*(long *)in + -0x18) + 0x18);
  *(undefined4 *)(in + *(long *)(*(long *)in + -0x18) + 0x18) = 0x26;
  local_21.c = '(';
  pbVar2 = utility::operator>>(in,&local_21);
  piVar3 = std::istream::_M_extract<float>((float *)pbVar2);
  local_22.c = ' ';
  pbVar2 = utility::operator>>((basic_istream<char,_std::char_traits<char>_> *)piVar3,&local_22);
  piVar3 = std::istream::_M_extract<float>((float *)pbVar2);
  local_23.c = ')';
  utility::operator>>((basic_istream<char,_std::char_traits<char>_> *)piVar3,&local_23);
  if (((byte)in[*(long *)(*(long *)in + -0x18) + 0x20] & 5) == 0) {
    P->gamma_ = local_1c;
    P->theta_ = local_20;
  }
  *(undefined4 *)(in + *(long *)(*(long *)in + -0x18) + 0x18) = uVar1;
  return in;
}

Assistant:

std::basic_istream<char_t, traits_t> &operator>>(
          std::basic_istream<char_t, traits_t> &in, param_type &P) {
        float_t gamma, theta;
        std::ios_base::fmtflags flags(in.flags());
        in.flags(std::ios_base::dec | std::ios_base::fixed | std::ios_base::left);
        in >> utility::delim('(') >> gamma >> utility::delim(' ') >> theta >>
            utility::delim(')');
        if (in)
          P = param_type(gamma, theta);
        in.flags(flags);
        return in;
      }